

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_miniscript_thresh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  miniscript_node_t *node_00;
  long lVar5;
  bool bVar6;
  size_t output_len;
  uchar *local_40;
  ulong *local_38;
  
  node_00 = node->child;
  uVar2 = 0x208;
  if (script_len < 0x208) {
    uVar2 = script_len;
  }
  if ((node_00 == (miniscript_node_t *)0x0) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    return -2;
  }
  lVar5 = 0;
  uVar3 = 0;
  local_40 = script;
  local_38 = write_len;
  while( true ) {
    node_00 = node_00->next;
    if (node_00 == (miniscript_node_t *)0x0) {
      iVar1 = generate_script_from_miniscript
                        (node->child,node,derive_child_num,local_40 + uVar3,~uVar3 + script_len,
                         &output_len);
      if (iVar1 != 0) {
        return iVar1;
      }
      uVar4 = output_len + uVar3 + 1;
      if (uVar4 < uVar2) {
        local_40[output_len + uVar3] = 0x87;
        *local_38 = uVar4;
        return 0;
      }
      return -2;
    }
    output_len = 0;
    iVar1 = generate_script_from_miniscript
                      (node_00,node,derive_child_num,local_40 + uVar3,~uVar3 + script_len,
                       &output_len);
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar4 = uVar3 + output_len;
    if (uVar2 <= uVar4) break;
    bVar6 = lVar5 != 0;
    lVar5 = lVar5 + -1;
    uVar3 = uVar4;
    if (bVar6) {
      uVar3 = uVar4 + 1;
      if (uVar2 <= uVar3) {
        return -2;
      }
      local_40[uVar4] = 0x93;
    }
  }
  return -2;
}

Assistant:

static int generate_by_miniscript_thresh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    /* [X1] [X2] ADD ... [Xn] ADD <k> EQUAL */
    int ret;
    size_t output_len;
    size_t offset = 0;
    size_t count = 0;
    struct miniscript_node_t *child = node->child;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    child = child->next;
    while (child != NULL) {
        output_len = 0;
        ret = generate_script_from_miniscript(child,
                                              node,
                                              derive_child_num,
                                              &script[offset],
                                              script_len - offset - 1,
                                              &output_len);
        if (ret != WALLY_OK)
            return ret;

        ++count;
        offset += output_len;
        if (offset >= check_len)
            return WALLY_EINVAL;

        if (count != 1) {
            if (offset + 1 >= check_len)
                return WALLY_EINVAL;

            script[offset] = OP_ADD;
            ++offset;
        }

        child = child->next;
    }

    ret = generate_script_from_miniscript(node->child,
                                          node,
                                          derive_child_num,
                                          &script[offset],
                                          script_len - offset - 1,
                                          &output_len);
    if (ret != WALLY_OK)
        return ret;

    offset += output_len;
    if (offset + 1 >= check_len)
        return WALLY_EINVAL;

    script[offset] = OP_EQUAL;
    *write_len = offset + 1;
    return WALLY_OK;
}